

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatTest_OutputIterators_Test::TestBody(FormatTest_OutputIterators_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar_1;
  AssertHelper local_1e0;
  AssertionResult gtest_ar;
  list<char,_std::allocator<char>_> out;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_1a0;
  stringstream s;
  undefined4 uStack_18c;
  ostream_type local_180 [376];
  
  out.super__List_base<char,_std::allocator<char>_>._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&out;
  out.super__List_base<char,_std::allocator<char>_>._M_impl._M_node._M_size = 0;
  _s = 0x2a;
  out.super__List_base<char,_std::allocator<char>_>._M_impl._M_node.super__List_node_base._M_prev =
       out.super__List_base<char,_std::allocator<char>_>._M_impl._M_node.super__List_node_base.
       _M_next;
  fmt::v5::
  format_to<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char[3],int>
            ((back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)
             out.super__List_base<char,_std::allocator<char>_>._M_impl._M_node.super__List_node_base
             ._M_next,(char (*) [3])0x1f0c36,(int *)&s);
  _s = (pointer)local_180;
  std::__cxx11::string::_M_construct<std::_List_iterator<char>>
            ((string *)&s,
             out.super__List_base<char,_std::allocator<char>_>._M_impl._M_node.super__List_node_base
             ._M_next);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42\"","std::string(out.begin(), out.end())",
             (char (*) [3])0x1f1bef,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
  std::__cxx11::string::~string((string *)&s);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&s);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x7f9,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&s);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&s);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  local_1a0._M_string = (char *)0x0;
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  local_1a0._M_stream = local_180;
  fmt::v5::format_to<std::ostream_iterator<char,char,std::char_traits<char>>,char[3],int>
            ((v5 *)&gtest_ar,&local_1a0,(char (*) [3])0x1f0c36,(int *)&gtest_ar_1);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"42\"","s.str()",(char (*) [3])0x1f1bef,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x7fc,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  std::__cxx11::_List_base<char,_std::allocator<char>_>::_M_clear
            (&out.super__List_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

TEST(FormatTest, OutputIterators) {
  std::list<char> out;
  fmt::format_to(std::back_inserter(out), "{}", 42);
  EXPECT_EQ("42", std::string(out.begin(), out.end()));
  std::stringstream s;
  fmt::format_to(std::ostream_iterator<char>(s), "{}", 42);
  EXPECT_EQ("42", s.str());
}